

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O3

void __thiscall b_tree_node::_remove(b_tree_node *this,int64_t k)

{
  ulong uVar1;
  ulong uVar2;
  b_tree_node child;
  b_tree_node bStack_78;
  
  uVar2 = (ulong)*this->_num_keys_field;
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    uVar1 = 0;
    do {
      if (k <= this->_keys_field[uVar1]) {
        uVar2 = uVar1;
        if (this->_keys_field[uVar1] == k) {
          this->_valid_keys_field[uVar1] = '\0';
          return;
        }
        break;
      }
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  if (*this->_leaf_field == 0) {
    b_tree_node(&bStack_78,this->_p,this->_child_ofs_field[uVar2 & 0xffff]);
    _remove(&bStack_78,k);
    r_memory_map::~r_memory_map(&bStack_78._mm);
  }
  return;
}

Assistant:

void b_tree_node::_remove(int64_t k)
{
    int i = 0;
    while(i < _num_keys() && _keys_field[i] < k)
        i++;

    if(i < _num_keys() && _keys_field[i] == k)
    {
        _valid_keys_field[i] = 0;
        return;
    }

   if(_leaf())
        return;

    b_tree_node child(_p, _child_ofs(i));
    child._remove(k);
}